

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void testSelect(void)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  streambuf *psVar4;
  size_type sVar5;
  reference pvVar6;
  ElementData *pEVar7;
  char *pcVar8;
  undefined8 uVar9;
  char *in_RCX;
  fd_set *in_R8;
  char *in_R9;
  undefined8 in_stack_fffffffffffff998;
  undefined4 uVar10;
  undefined8 in_stack_fffffffffffff9a0;
  undefined4 uVar11;
  string local_5b8;
  string local_598;
  undefined1 local_578 [8];
  Node mainNode;
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [32];
  Node *result;
  iterator __end1;
  iterator __begin1;
  Nodes *__range1;
  undefined1 local_488 [32];
  undefined1 local_468 [8];
  Nodes nodes;
  Node node;
  string source;
  stringstream local_398 [8];
  stringstream buffer;
  ostream local_388 [376];
  undefined1 local_210 [8];
  ifstream file;
  
  std::ifstream::ifstream(local_210,"source/parseTest.html",8);
  std::__cxx11::stringstream::stringstream(local_398);
  psVar4 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_388,psVar4);
  std::__cxx11::stringstream::str();
  crawler::parse((Node *)&nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (string *)
                 &node.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_488,"div",(allocator<char> *)((long)&__range1 + 7));
  crawler::Node::select
            ((Node *)local_468,(int)&nodes + 0x10,(fd_set *)local_488,(fd_set *)in_RCX,in_R8,
             (timeval *)in_R9);
  std::__cxx11::string::~string((string *)local_488);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  __end1 = std::vector<crawler::Node,_std::allocator<crawler::Node>_>::begin
                     ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_468);
  result = (Node *)std::vector<crawler::Node,_std::allocator<crawler::Node>_>::end
                             ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_468);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<crawler::Node_*,_std::vector<crawler::Node,_std::allocator<crawler::Node>_>_>
                                *)&result);
    uVar11 = (undefined4)((ulong)in_stack_fffffffffffff9a0 >> 0x20);
    uVar10 = (undefined4)((ulong)in_stack_fffffffffffff998 >> 0x20);
    if (!bVar2) break;
    local_4c8._24_8_ =
         __gnu_cxx::
         __normal_iterator<crawler::Node_*,_std::vector<crawler::Node,_std::allocator<crawler::Node>_>_>
         ::operator*(&__end1);
    test_count = test_count + 1;
    pEVar7 = crawler::Node::getElementData((Node *)local_4c8._24_8_);
    crawler::ElementData::getTagName_abi_cxx11_(pEVar7);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    iVar3 = strcmp(pcVar8,"div");
    pFVar1 = _stderr;
    if (iVar3 == 0) {
      test_pass = test_pass + 1;
    }
    else {
      pEVar7 = crawler::Node::getElementData((Node *)local_4c8._24_8_);
      crawler::ElementData::getTagName_abi_cxx11_(pEVar7);
      in_stack_fffffffffffff998 = std::__cxx11::string::c_str();
      in_RCX = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp";
      in_R8 = (fd_set *)0xd5;
      in_R9 = "strcmp((result.getElementData().getTagName().c_str()), (\"div\")) == 0";
      in_stack_fffffffffffff9a0 = 0;
      fprintf(pFVar1,"function %s(): %s:%d  Assertion `%s` failed. expect: %s actual: %s\n",
              "testSelect");
      main_ret = 1;
    }
    __gnu_cxx::
    __normal_iterator<crawler::Node_*,_std::vector<crawler::Node,_std::allocator<crawler::Node>_>_>
    ::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4e8,"#main",
             (allocator<char> *)
             ((long)&mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  crawler::Node::select
            ((Node *)local_4c8,(int)&nodes + 0x10,(fd_set *)local_4e8,(fd_set *)in_RCX,in_R8,
             (timeval *)in_R9);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::operator=
            ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_468,
             (vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_4c8);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector
            ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_4c8);
  std::__cxx11::string::~string((string *)local_4e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  test_count = test_count + 1;
  sVar5 = std::vector<crawler::Node,_std::allocator<crawler::Node>_>::size
                    ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_468);
  pFVar1 = _stderr;
  if (sVar5 == 1) {
    test_pass = test_pass + 1;
  }
  else {
    sVar5 = std::vector<crawler::Node,_std::allocator<crawler::Node>_>::size
                      ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_468);
    fprintf(pFVar1,"function %s(): %s:%d  Assertion `%s` failed. expect: %d actual: %d\n",
            "testSelect",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0xd8,"true == (nodes.size() == 1)",CONCAT44(uVar10,1),
            CONCAT44(uVar11,(uint)(sVar5 == 1)));
    main_ret = 1;
  }
  pvVar6 = std::vector<crawler::Node,_std::allocator<crawler::Node>_>::front
                     ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_468);
  crawler::Node::Node((Node *)local_578,pvVar6);
  test_count = test_count + 1;
  pEVar7 = crawler::Node::getElementData((Node *)local_578);
  crawler::ElementData::getTagName_abi_cxx11_(pEVar7);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  iVar3 = strcmp(pcVar8,"div");
  pFVar1 = _stderr;
  if (iVar3 == 0) {
    test_pass = test_pass + 1;
  }
  else {
    pEVar7 = crawler::Node::getElementData((Node *)local_578);
    crawler::ElementData::getTagName_abi_cxx11_(pEVar7);
    uVar9 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"function %s(): %s:%d  Assertion `%s` failed. expect: %s actual: %s\n",
            "testSelect",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0xda,"strcmp((mainNode.getElementData().getTagName().c_str()), (\"div\")) == 0",uVar9,
            "div");
    main_ret = 1;
  }
  test_count = test_count + 1;
  pEVar7 = crawler::Node::getElementData((Node *)local_578);
  crawler::ElementData::clazz_abi_cxx11_(&local_598,pEVar7);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  iVar3 = strcmp(pcVar8,"test");
  std::__cxx11::string::~string((string *)&local_598);
  pFVar1 = _stderr;
  if (iVar3 == 0) {
    test_pass = test_pass + 1;
  }
  else {
    pEVar7 = crawler::Node::getElementData((Node *)local_578);
    crawler::ElementData::clazz_abi_cxx11_(&local_5b8,pEVar7);
    uVar9 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"function %s(): %s:%d  Assertion `%s` failed. expect: %s actual: %s\n",
            "testSelect",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0xdb,"strcmp((mainNode.getElementData().clazz().c_str()), (\"test\")) == 0",uVar9,
            "test");
    std::__cxx11::string::~string((string *)&local_5b8);
    main_ret = 1;
  }
  crawler::Node::~Node((Node *)local_578);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector
            ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_468);
  crawler::Node::~Node
            ((Node *)&nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &node.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::stringstream::~stringstream(local_398);
  std::ifstream::~ifstream(local_210);
  return;
}

Assistant:

void testSelect() {
  std::ifstream file("source/parseTest.html");
  std::stringstream buffer;
  buffer << file.rdbuf();
  std::string source = buffer.str();
  crawler::Node node = crawler::parse(source);
  crawler::Nodes nodes = node.select("div");
  for (auto const &result : nodes) {
    ASSERT_CSTRING_EQ(result.getElementData().getTagName().c_str(), "div");
  }
  nodes = node.select("#main");
  ASSERT_TRUE(nodes.size() == 1);
  crawler::Node mainNode = nodes.front();
  ASSERT_CSTRING_EQ(mainNode.getElementData().getTagName().c_str(), "div");
  ASSERT_CSTRING_EQ(mainNode.getElementData().clazz().c_str(), "test");
}